

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::GPBGenericValueFieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  CppType CVar1;
  Type TVar2;
  LogMessage *other;
  char *__s;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (*(int *)(this + 0x4c) == 3) {
switchD_0025f6a3_caseD_a:
    __s = "valueMessage";
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
    switch(CVar1) {
    case CPPTYPE_INT32:
      __s = "valueInt32";
      break;
    case CPPTYPE_INT64:
      __s = "valueInt64";
      break;
    case CPPTYPE_UINT32:
      __s = "valueUInt32";
      break;
    case CPPTYPE_UINT64:
      __s = "valueUInt64";
      break;
    case CPPTYPE_DOUBLE:
      __s = "valueDouble";
      break;
    case CPPTYPE_FLOAT:
      __s = "valueFloat";
      break;
    case CPPTYPE_BOOL:
      __s = "valueBool";
      break;
    case CPPTYPE_ENUM:
      __s = "valueEnum";
      break;
    case CPPTYPE_STRING:
      TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
      if (TVar2 == TYPE_BYTES) {
        __s = "valueData";
      }
      else {
        __s = "valueString";
      }
      break;
    case CPPTYPE_MESSAGE:
      goto switchD_0025f6a3_caseD_a;
    default:
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                 ,0x2df);
      other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_49,other);
      internal::LogMessage::~LogMessage(&local_48);
      __s = (char *)0x0;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string GPBGenericValueFieldName(const FieldDescriptor* field) {
  // Returns the field within the GPBGenericValue union to use for the given
  // field.
  if (field->is_repeated()) {
      return "valueMessage";
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return "valueInt32";
    case FieldDescriptor::CPPTYPE_UINT32:
      return "valueUInt32";
    case FieldDescriptor::CPPTYPE_INT64:
      return "valueInt64";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "valueUInt64";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "valueFloat";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "valueDouble";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "valueBool";
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        return "valueData";
      } else {
        return "valueString";
      }
    case FieldDescriptor::CPPTYPE_ENUM:
      return "valueEnum";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "valueMessage";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}